

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_sw_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [32];
  __m256i c;
  __m256i c_00;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  parasail_result_t *result;
  __m256i *palVar9;
  __m256i *palVar10;
  __m256i *palVar11;
  __m256i *b;
  __m256i *palVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  char *__format;
  ulong uVar17;
  int iVar18;
  int iVar19;
  char cVar20;
  ulong uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_stack_ffffffffffffff18 [12];
  undefined4 uVar30;
  uint uVar31;
  undefined4 in_stack_ffffffffffffff34;
  ulong local_c8;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar2 = (profile->profile8).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile8.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else {
          local_c8 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar15 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "open";
          }
          else {
            if (-1 < gap) {
              iVar8 = ppVar3->max;
              result = parasail_result_new();
              if (result != (parasail_result_t *)0x0) {
                uVar21 = (ulong)uVar1 + 0x1f >> 5;
                result->flag = result->flag | 0x20100804;
                palVar9 = parasail_memalign___m256i(0x20,uVar21);
                palVar10 = parasail_memalign___m256i(0x20,uVar21);
                palVar11 = parasail_memalign___m256i(0x20,uVar21);
                b = parasail_memalign___m256i(0x20,uVar21);
                if ((b != (__m256i *)0x0 && palVar11 != (__m256i *)0x0) &&
                    (palVar10 != (__m256i *)0x0 && palVar9 != (__m256i *)0x0)) {
                  iVar16 = 0;
                  uVar30 = 0;
                  uVar22 = (undefined1)open;
                  uVar23 = (undefined1)gap;
                  c[1]._4_4_ = iVar8;
                  c._0_12_ = in_stack_ffffffffffffff18;
                  c[2] = 0;
                  c[3]._0_4_ = gap;
                  c[3]._4_4_ = in_stack_ffffffffffffff34;
                  parasail_memset___m256i(palVar9,c,uVar21);
                  c_00[1]._4_4_ = iVar8;
                  c_00._0_12_ = in_stack_ffffffffffffff18;
                  c_00[2]._0_4_ = iVar16;
                  c_00[2]._4_4_ = uVar30;
                  c_00[3]._0_4_ = gap;
                  c_00[3]._4_4_ = in_stack_ffffffffffffff34;
                  parasail_memset___m256i(b,c_00,uVar21);
                  auVar5._8_8_ = 0x8080808080808080;
                  auVar5._0_8_ = 0x8080808080808080;
                  auVar5._16_8_ = 0x8080808080808080;
                  auVar5._24_8_ = 0x8080808080808080;
                  uVar31 = (uint)uVar21;
                  auVar25 = ZEXT3264(CONCAT131(0x80,CONCAT130(0x80,CONCAT129(0x80,CONCAT128(0x80,
                                                  CONCAT127(0x80,CONCAT126(0x80,CONCAT125(0x80,
                                                  CONCAT124(0x80,CONCAT123(0x80,CONCAT122(0x80,
                                                  CONCAT121(0x80,CONCAT120(0x80,CONCAT119(0x80,
                                                  CONCAT118(0x80,CONCAT117(0x80,CONCAT116(0x80,
                                                  CONCAT115(0x80,CONCAT114(0x80,CONCAT113(0x80,
                                                  CONCAT112(0x80,CONCAT111(0x80,CONCAT110(0x80,
                                                  CONCAT19(0x80,CONCAT18(0x80,0x8080808080808080))))
                                                  )))))))))))))))))))));
                  cVar20 = -0x80;
                  uVar17 = 0;
                  auVar24 = ZEXT3264(auVar5);
                  auVar7[1] = uVar22;
                  auVar7[0] = uVar22;
                  auVar7[2] = uVar22;
                  auVar7[3] = uVar22;
                  auVar7[4] = uVar22;
                  auVar7[5] = uVar22;
                  auVar7[6] = uVar22;
                  auVar7[7] = uVar22;
                  auVar7[8] = uVar22;
                  auVar7[9] = uVar22;
                  auVar7[10] = uVar22;
                  auVar7[0xb] = uVar22;
                  auVar7[0xc] = uVar22;
                  auVar7[0xd] = uVar22;
                  auVar7[0xe] = uVar22;
                  auVar7[0xf] = uVar22;
                  auVar7[0x10] = uVar22;
                  auVar7[0x11] = uVar22;
                  auVar7[0x12] = uVar22;
                  auVar7[0x13] = uVar22;
                  auVar7[0x14] = uVar22;
                  auVar7[0x15] = uVar22;
                  auVar7[0x16] = uVar22;
                  auVar7[0x17] = uVar22;
                  auVar7[0x18] = uVar22;
                  auVar7[0x19] = uVar22;
                  auVar7[0x1a] = uVar22;
                  auVar7[0x1b] = uVar22;
                  auVar7[0x1c] = uVar22;
                  auVar7[0x1d] = uVar22;
                  auVar7[0x1e] = uVar22;
                  auVar7[0x1f] = uVar22;
                  auVar6[1] = uVar23;
                  auVar6[0] = uVar23;
                  auVar6[2] = uVar23;
                  auVar6[3] = uVar23;
                  auVar6[4] = uVar23;
                  auVar6[5] = uVar23;
                  auVar6[6] = uVar23;
                  auVar6[7] = uVar23;
                  auVar6[8] = uVar23;
                  auVar6[9] = uVar23;
                  auVar6[10] = uVar23;
                  auVar6[0xb] = uVar23;
                  auVar6[0xc] = uVar23;
                  auVar6[0xd] = uVar23;
                  auVar6[0xe] = uVar23;
                  auVar6[0xf] = uVar23;
                  auVar6[0x10] = uVar23;
                  auVar6[0x11] = uVar23;
                  auVar6[0x12] = uVar23;
                  auVar6[0x13] = uVar23;
                  auVar6[0x14] = uVar23;
                  auVar6[0x15] = uVar23;
                  auVar6[0x16] = uVar23;
                  auVar6[0x17] = uVar23;
                  auVar6[0x18] = uVar23;
                  auVar6[0x19] = uVar23;
                  auVar6[0x1a] = uVar23;
                  auVar6[0x1b] = uVar23;
                  auVar6[0x1c] = uVar23;
                  auVar6[0x1d] = uVar23;
                  auVar6[0x1e] = uVar23;
                  auVar6[0x1f] = uVar23;
                  do {
                    if (uVar17 == local_c8) {
LAB_0071e4e8:
                      if (cVar20 == '\x7f') {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                      }
                      iVar8 = parasail_result_is_saturated(result);
                      palVar12 = palVar11;
                      if (iVar8 == 0) {
                        iVar13 = (int)local_c8 + -1;
                        iVar8 = (int)local_c8 + -2;
                        if (iVar16 == iVar8) {
                          palVar12 = palVar10;
                        }
                        if (iVar16 == iVar13) {
                          palVar12 = palVar9;
                          palVar9 = palVar11;
                        }
                        iVar19 = uVar1 - 1;
                        for (uVar21 = 0; (uVar31 & 0x3ffffff) << 5 != (uint)uVar21;
                            uVar21 = uVar21 + 1) {
                          if ((*(char *)((long)*palVar12 + uVar21) == cVar20) &&
                             (iVar18 = ((uint)uVar21 & 0x1f) * uVar31 +
                                       ((uint)(uVar21 >> 5) & 0x7ffffff), iVar18 < iVar19)) {
                            iVar19 = iVar18;
                          }
                        }
                        if (iVar16 != iVar8) {
                          palVar11 = palVar10;
                        }
                        if (iVar16 != iVar13) {
                          palVar10 = palVar11;
                        }
                        iVar8 = cVar20 + 0x80;
                      }
                      else {
                        iVar16 = 0;
                        iVar8 = 0xff;
                        iVar19 = 0;
                      }
                      result->score = iVar8;
                      result->end_query = iVar19;
                      result->end_ref = iVar16;
                      parasail_free(b);
                      parasail_free(palVar12);
                      parasail_free(palVar10);
                      parasail_free(palVar9);
                      return result;
                    }
                    auVar26 = SUB3216(palVar9[uVar31 - 1],0);
                    auVar28._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar24._0_16_;
                    auVar28._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar26;
                    auVar28 = vpalignr_avx2((undefined1  [32])palVar9[uVar31 - 1],auVar28,0xf);
                    auVar26 = vpinsrb_avx(auVar28._0_16_,0x80,0);
                    auVar28 = vpblendd_avx2(auVar28,ZEXT1632(auVar26),0xf);
                    iVar13 = ppVar3->mapper[(byte)s2[uVar17]];
                    iVar19 = (int)uVar17 + -2;
                    palVar12 = palVar10;
                    if (iVar16 == iVar19) {
                      palVar12 = palVar11;
                    }
                    auVar27 = auVar5;
                    for (lVar14 = 0; uVar21 * 0x20 != lVar14; lVar14 = lVar14 + 0x20) {
                      auVar29 = vpaddsb_avx2(auVar28,*(undefined1 (*) [32])
                                                      ((long)pvVar2 +
                                                      lVar14 + (long)(int)(iVar13 * uVar31) * 0x20))
                      ;
                      auVar28 = *(undefined1 (*) [32])((long)*b + lVar14);
                      auVar4 = vpmaxsb_avx2(auVar28,auVar27);
                      auVar29 = vpmaxsb_avx2(auVar29,auVar4);
                      *(undefined1 (*) [32])((long)*palVar12 + lVar14) = auVar29;
                      auVar4 = vpmaxsb_avx2(auVar29,auVar24._0_32_);
                      auVar24 = ZEXT3264(auVar4);
                      auVar29 = vpsubsb_avx2(auVar29,auVar7);
                      auVar28 = vpsubsb_avx2(auVar28,auVar6);
                      auVar28 = vpmaxsb_avx2(auVar28,auVar29);
                      *(undefined1 (*) [32])((long)*b + lVar14) = auVar28;
                      auVar28 = vpsubsb_avx2(auVar27,auVar6);
                      auVar27 = vpmaxsb_avx2(auVar28,auVar29);
                      auVar28 = *(undefined1 (*) [32])((long)*palVar9 + lVar14);
                    }
                    if (iVar16 == iVar19) {
                      palVar11 = palVar10;
                    }
                    for (iVar13 = 0; iVar13 != 0x20; iVar13 = iVar13 + 1) {
                      auVar29._0_16_ = ZEXT116(0) * auVar27._0_16_ + ZEXT116(1) * auVar24._0_16_;
                      auVar29._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar27._0_16_;
                      auVar28 = vpalignr_avx2(auVar27,auVar29,0xf);
                      auVar26 = vpinsrb_avx(auVar28._0_16_,0x80,0);
                      auVar27 = vpblendd_avx2(auVar28,ZEXT1632(auVar26),0xf);
                      lVar14 = 0;
                      while (uVar21 * 0x20 + 0x20 != lVar14 + 0x20) {
                        auVar28 = vpmaxsb_avx2(auVar27,*(undefined1 (*) [32])
                                                        ((long)*palVar12 + lVar14));
                        *(undefined1 (*) [32])((long)*palVar12 + lVar14) = auVar28;
                        auVar29 = vpmaxsb_avx2(auVar28,auVar24._0_32_);
                        auVar24 = ZEXT3264(auVar29);
                        auVar28 = vpsubsb_avx2(auVar28,auVar7);
                        auVar27 = vpsubsb_avx2(auVar27,auVar6);
                        auVar28 = vpcmpgtb_avx2(auVar27,auVar28);
                        lVar14 = lVar14 + 0x20;
                        if ((((((((((((((((((((((((((((((((auVar28 >> 7 & (undefined1  [32])0x1) ==
                                                          (undefined1  [32])0x0 &&
                                                         (auVar28 >> 0xf & (undefined1  [32])0x1) ==
                                                         (undefined1  [32])0x0) &&
                                                        (auVar28 >> 0x17 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0) &&
                                                       (auVar28 >> 0x1f & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar28 >> 0x27 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar28 >> 0x2f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar28 >> 0x37 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar28 >> 0x3f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar28 >> 0x47 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar28 >> 0x4f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar28 >> 0x57 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar28 >> 0x5f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar28 >> 0x67 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar28 >> 0x6f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar28 >> 0x77 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar28 >> 0x7f,0) == '\0') &&
                                          (auVar28 >> 0x87 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar28 >> 0x8f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar28 >> 0x97 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar28 >> 0x9f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar28 >> 0xa7 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar28 >> 0xaf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar28 >> 0xb7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar28 >> 0xbf,0) == '\0') &&
                                  (auVar28 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar28 >> 0xcf & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar28 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar28 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar28 >> 0xe7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar28 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar28 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            -1 < auVar28[0x1f]) goto LAB_0071e451;
                      }
                    }
LAB_0071e451:
                    auVar27 = auVar24._0_32_;
                    auVar28 = vpcmpgtb_avx2(auVar27,auVar25._0_32_);
                    palVar10 = palVar9;
                    palVar9 = palVar12;
                    if ((((((((((((((((((((((((((((((((auVar28 >> 7 & (undefined1  [32])0x1) !=
                                                      (undefined1  [32])0x0 ||
                                                     (auVar28 >> 0xf & (undefined1  [32])0x1) !=
                                                     (undefined1  [32])0x0) ||
                                                    (auVar28 >> 0x17 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0) ||
                                                   (auVar28 >> 0x1f & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar28 >> 0x27 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar28 >> 0x2f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar28 >> 0x37 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar28 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar28 >> 0x47 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar28 >> 0x4f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar28 >> 0x57 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar28 >> 0x5f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar28 >> 0x67 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar28 >> 0x6f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar28 >> 0x77 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar28 >> 0x7f,0) != '\0')
                                      || (auVar28 >> 0x87 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                     (auVar28 >> 0x8f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar28 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar28 >> 0x9f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar28 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar28 >> 0xaf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar28 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar28 >> 0xbf,0) != '\0') ||
                              (auVar28 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar28 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar28 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar28 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar28 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar28 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar28 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        auVar28[0x1f] < '\0') {
                      auVar28 = vpermq_avx2(auVar27,0x44);
                      auVar28 = vpmaxsb_avx2(auVar27,auVar28);
                      auVar27 = vpslldq_avx2(auVar28,8);
                      auVar28 = vpmaxsb_avx2(auVar28,auVar27);
                      auVar27 = vpslldq_avx2(auVar28,4);
                      auVar28 = vpmaxsb_avx2(auVar28,auVar27);
                      auVar27 = vpslldq_avx2(auVar28,2);
                      auVar28 = vpmaxsb_avx2(auVar28,auVar27);
                      auVar27 = vpslldq_avx2(auVar28,1);
                      auVar28 = vpmaxsb_avx2(auVar28,auVar27);
                      cVar20 = auVar28[0x17];
                      if ((char)('~' - (char)iVar8) < cVar20) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                        local_c8 = uVar17;
                        goto LAB_0071e4e8;
                      }
                      auVar27[8] = 0xf;
                      auVar27._0_8_ = 0xf0f0f0f0f0f0f0f;
                      auVar27[9] = 0xf;
                      auVar27[10] = 0xf;
                      auVar27[0xb] = 0xf;
                      auVar27[0xc] = 0xf;
                      auVar27[0xd] = 0xf;
                      auVar27[0xe] = 0xf;
                      auVar27[0xf] = 0xf;
                      auVar27[0x10] = 0xf;
                      auVar27[0x11] = 0xf;
                      auVar27[0x12] = 0xf;
                      auVar27[0x13] = 0xf;
                      auVar27[0x14] = 0xf;
                      auVar27[0x15] = 0xf;
                      auVar27[0x16] = 0xf;
                      auVar27[0x17] = 0xf;
                      auVar27[0x18] = 0xf;
                      auVar27[0x19] = 0xf;
                      auVar27[0x1a] = 0xf;
                      auVar27[0x1b] = 0xf;
                      auVar27[0x1c] = 0xf;
                      auVar27[0x1d] = 0xf;
                      auVar27[0x1e] = 0xf;
                      auVar27[0x1f] = 0xf;
                      auVar28 = vpshufb_avx2(auVar28,auVar27);
                      auVar28 = vpermq_avx2(auVar28,0xaa);
                      auVar25 = ZEXT3264(auVar28);
                      iVar16 = (int)uVar17;
                    }
                    uVar17 = uVar17 + 1;
                  } while( true );
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_striped_profile_avx2_256_8",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}